

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O1

PAL_ERROR CorUnix::InternalCreatePipe
                    (CPalThread *pThread,HANDLE *phReadPipe,HANDLE *phWritePipe,
                    LPSECURITY_ATTRIBUTES lpPipeAttributes,DWORD nSize)

{
  uint __errnum;
  FILE *__stream;
  int iVar1;
  PAL_ERROR PVar2;
  int *piVar3;
  uint *puVar4;
  char *pcVar5;
  undefined8 uVar6;
  undefined8 uStack_80;
  CObjectAttributes oaFile;
  IPalObject *pReadRegisteredFile;
  IPalObject *pWriteRegisteredFile;
  CFileProcessLocalData *pLocalData;
  IPalObject *pReadFileObject;
  IPalObject *pWriteFileObject;
  IDataLock *pDataLock;
  int readWritePipeDes [2];
  
  pLocalData = (CFileProcessLocalData *)0x0;
  oaFile.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)0x0;
  pReadFileObject = (IPalObject *)0x0;
  pReadRegisteredFile = (IPalObject *)0x0;
  pWriteFileObject = (IPalObject *)0x0;
  pWriteRegisteredFile = (IPalObject *)0x0;
  uStack_80 = 0;
  oaFile.sObjectName.m_pwsz = (WCHAR *)0x0;
  pDataLock = (IDataLock *)&DAT_ffffffffffffffff;
  oaFile.sObjectName._8_8_ = lpPipeAttributes;
  if (phReadPipe == (HANDLE *)0x0 || phWritePipe == (HANDLE *)0x0) {
    PVar2 = 0x57;
    if (!PAL_InitializeChakraCoreCalled) {
LAB_0032e030:
      abort();
    }
  }
  else if (((lpPipeAttributes == (LPSECURITY_ATTRIBUTES)0x0) ||
           (lpPipeAttributes->bInheritHandle == 0)) ||
          (lpPipeAttributes->lpSecurityDescriptor != (LPVOID)0x0)) {
    fprintf(_stderr,"] %s %s:%d","InternalCreatePipe",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
            ,0x1076);
    fprintf(_stderr,"invalid security attributes!\n");
    PVar2 = 0x57;
  }
  else {
    iVar1 = pipe((int *)&pDataLock);
    if (iVar1 == -1) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0032e030;
      piVar3 = __errno_location();
      strerror(*piVar3);
    }
    else {
      iVar1 = fcntl64((ulong)pDataLock & 0xffffffff,2,1);
      if (iVar1 == -1) {
        uVar6 = 0x1087;
      }
      else {
        iVar1 = fcntl64(pDataLock._4_4_,2,1);
        if (iVar1 != -1) {
          PVar2 = (**(code **)*g_pObjectManager)
                            (g_pObjectManager,pThread,&otFile,&uStack_80,&pLocalData);
          if ((PVar2 == 0) &&
             (PVar2 = (*(code *)pLocalData->pLockController[3]._vptr_IFileLockController)
                                (pLocalData,pThread,1,&pWriteFileObject,&pWriteRegisteredFile),
             PVar2 == 0)) {
            *(undefined4 *)&pWriteRegisteredFile[0x203]._vptr_IPalObject = 1;
            *(undefined4 *)&pWriteRegisteredFile[2]._vptr_IPalObject = 0;
            *(int *)&pWriteRegisteredFile[1]._vptr_IPalObject = (int)pDataLock;
            pDataLock = (IDataLock *)CONCAT44(pDataLock._4_4_,0xffffffff);
            (**pWriteFileObject->_vptr_IPalObject)(pWriteFileObject,pThread,1);
            pWriteFileObject = (IPalObject *)0x0;
            PVar2 = (**(code **)*g_pObjectManager)
                              (g_pObjectManager,pThread,&otFile,&uStack_80,&pReadFileObject);
            if ((PVar2 == 0) &&
               (PVar2 = (*pReadFileObject->_vptr_IPalObject[3])
                                  (pReadFileObject,pThread,1,&pWriteFileObject,&pWriteRegisteredFile
                                  ), PVar2 == 0)) {
              *(undefined4 *)&pWriteRegisteredFile[0x203]._vptr_IPalObject = 1;
              *(undefined4 *)&pWriteRegisteredFile[2]._vptr_IPalObject = 1;
              *(int *)&pWriteRegisteredFile[1]._vptr_IPalObject = pDataLock._4_4_;
              pDataLock = (IDataLock *)CONCAT44(0xffffffff,(int)pDataLock);
              (**pWriteFileObject->_vptr_IPalObject)(pWriteFileObject,pThread,1);
              pWriteFileObject = (IPalObject *)0x0;
              PVar2 = (**(code **)(*g_pObjectManager + 8))
                                (g_pObjectManager,pThread,pLocalData,aotFile,0x80000000,phReadPipe,
                                 &oaFile.pSecurityAttributes);
              pLocalData = (CFileProcessLocalData *)0x0;
              if (PVar2 == 0) {
                PVar2 = (**(code **)(*g_pObjectManager + 8))
                                  (g_pObjectManager,pThread,pReadFileObject,aotFile,0x40000000,
                                   phWritePipe,&pReadRegisteredFile);
                pReadFileObject = (IPalObject *)0x0;
              }
            }
          }
          goto LAB_0032e08e;
        }
        uVar6 = 0x108e;
      }
      fprintf(_stderr,"] %s %s:%d","InternalCreatePipe",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
              ,uVar6);
      __stream = _stderr;
      puVar4 = (uint *)__errno_location();
      __errnum = *puVar4;
      pcVar5 = strerror(__errnum);
      fprintf(__stream,"can\'t set close-on-exec flag; fcntl() failed. errno is %d (%s)\n",
              (ulong)__errnum,pcVar5);
    }
    PVar2 = 0x54f;
  }
LAB_0032e08e:
  if (PVar2 != 0) {
    if ((int)pDataLock != -1) {
      close((int)pDataLock);
    }
    if (pDataLock._4_4_ != -1) {
      close(pDataLock._4_4_);
    }
  }
  if (pLocalData != (CFileProcessLocalData *)0x0) {
    (*(code *)pLocalData->pLockController[8]._vptr_IFileLockController)(pLocalData,pThread);
  }
  if (oaFile.pSecurityAttributes != (LPSECURITY_ATTRIBUTES)0x0) {
    (**(code **)(*(long *)oaFile.pSecurityAttributes + 0x40))(oaFile.pSecurityAttributes,pThread);
  }
  if (pReadFileObject != (IPalObject *)0x0) {
    (*pReadFileObject->_vptr_IPalObject[8])(pReadFileObject,pThread);
  }
  if (pReadRegisteredFile != (IPalObject *)0x0) {
    (*pReadRegisteredFile->_vptr_IPalObject[8])(pReadRegisteredFile,pThread);
  }
  return PVar2;
}

Assistant:

PAL_ERROR
CorUnix::InternalCreatePipe(
    CPalThread *pThread,
    HANDLE *phReadPipe,
    HANDLE *phWritePipe,
    LPSECURITY_ATTRIBUTES lpPipeAttributes,
    DWORD nSize
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pReadFileObject = NULL;
    IPalObject *pReadRegisteredFile = NULL;
    IPalObject *pWriteFileObject = NULL;
    IPalObject *pWriteRegisteredFile = NULL;
    IDataLock *pDataLock = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    CObjectAttributes oaFile(NULL, lpPipeAttributes);
        
    int readWritePipeDes[2] = {-1, -1};

    if ((phReadPipe == NULL) || (phWritePipe == NULL))
    {
        ERROR("One of the two parameters hReadPipe(%p) and hWritePipe(%p) is Null\n",phReadPipe,phWritePipe);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreatePipeExit;
    }

    if ((lpPipeAttributes == NULL) || 
        (lpPipeAttributes->bInheritHandle == FALSE) ||
        (lpPipeAttributes->lpSecurityDescriptor != NULL))
    {
        ASSERT("invalid security attributes!\n");
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreatePipeExit;
    }

    if (pipe(readWritePipeDes) == -1)
    {
        ERROR("pipe() call failed errno:%d (%s) \n", errno, strerror(errno));
        palError = ERROR_INTERNAL_ERROR;
        goto InternalCreatePipeExit;
    }

    /* enable close-on-exec for both pipes; if one gets passed to CreateProcess
       it will be "uncloseonexeced" in order to be inherited */
    if(-1 == fcntl(readWritePipeDes[0],F_SETFD,1))
    {
        ASSERT("can't set close-on-exec flag; fcntl() failed. errno is %d "
             "(%s)\n", errno, strerror(errno));
        palError = ERROR_INTERNAL_ERROR;
        goto InternalCreatePipeExit;
    }
    if(-1 == fcntl(readWritePipeDes[1],F_SETFD,1))
    {
        ASSERT("can't set close-on-exec flag; fcntl() failed. errno is %d "
             "(%s)\n", errno, strerror(errno));
        palError = ERROR_INTERNAL_ERROR;
        goto InternalCreatePipeExit;
    }

    //
    // Setup the object for the read end of the pipe
    //

    palError = g_pObjectManager->AllocateObject(
        pThread,
        &otFile,
        &oaFile,
        &pReadFileObject
        );

    if (NO_ERROR != palError)
    {
        goto InternalCreatePipeExit;
    }

    palError = pReadFileObject->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto InternalCreatePipeExit;
    }

    pLocalData->inheritable = TRUE;
    pLocalData->open_flags = O_RDONLY;

    //
    // After storing the file descriptor in the object's local data
    // we want to clear it from the array to prevent a possible double
    // close if an error occurs.
    //

    pLocalData->unix_fd = readWritePipeDes[0];
    readWritePipeDes[0] = -1;

    pDataLock->ReleaseLock(pThread, TRUE);
    pDataLock = NULL;

    //
    // Setup the object for the write end of the pipe
    //

    palError = g_pObjectManager->AllocateObject(
        pThread,
        &otFile,
        &oaFile,
        &pWriteFileObject
        );

    if (NO_ERROR != palError)
    {
        goto InternalCreatePipeExit;
    }

    palError = pWriteFileObject->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto InternalCreatePipeExit;
    }

    pLocalData->inheritable = TRUE;
    pLocalData->open_flags = O_WRONLY;

    //
    // After storing the file descriptor in the object's local data
    // we want to clear it from the array to prevent a possible double
    // close if an error occurs.
    //

    pLocalData->unix_fd = readWritePipeDes[1];
    readWritePipeDes[1] = -1;

    pDataLock->ReleaseLock(pThread, TRUE);
    pDataLock = NULL;

    //
    // Register the pipe objects
    //

    palError = g_pObjectManager->RegisterObject(
        pThread,
        pReadFileObject,
        &aotFile,
        GENERIC_READ,
        phReadPipe,
        &pReadRegisteredFile
        );

    //
    // pReadFileObject is invalidated by the call to RegisterObject, so NULL it
    // out here to ensure that we don't try to release a reference on
    // it down the line.
    //

    pReadFileObject = NULL;

    if (NO_ERROR != palError)
    {
        goto InternalCreatePipeExit;
    }

    palError = g_pObjectManager->RegisterObject(
        pThread,
        pWriteFileObject,
        &aotFile,
        GENERIC_WRITE,
        phWritePipe,
        &pWriteRegisteredFile
        );

    //
    // pWriteFileObject is invalidated by the call to RegisterObject, so NULL it
    // out here to ensure that we don't try to release a reference on
    // it down the line.
    //

    pWriteFileObject = NULL;
    
InternalCreatePipeExit:

    if (NO_ERROR != palError)
    {
        if (-1 != readWritePipeDes[0])
        {
            close(readWritePipeDes[0]);
        }

        if (-1 != readWritePipeDes[1])
        {
            close(readWritePipeDes[1]);
        }
    }

    if (NULL != pReadFileObject)
    {
        pReadFileObject->ReleaseReference(pThread);
    }

    if (NULL != pReadRegisteredFile)
    {
        pReadRegisteredFile->ReleaseReference(pThread);
    }

    if (NULL != pWriteFileObject)
    {
        pWriteFileObject->ReleaseReference(pThread);
    }

    if (NULL != pWriteRegisteredFile)
    {
        pWriteRegisteredFile->ReleaseReference(pThread);
    }

    return palError;
}